

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeInitDrivers
          (uint32_t *pCount,ze_driver_handle_t *phDrivers,ze_init_driver_type_desc_t *desc)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ze_result_t unaff_R12D;
  ulong uVar8;
  bool bVar9;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = context;
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeInitDrivers(pCount, phDrivers, desc)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar3 + 0x98);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd30);
    lVar3 = *(long *)(lVar3 + 0xd38);
    uVar7 = lVar3 - lVar6 >> 3;
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        zVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,pCount,phDrivers,desc);
        if (zVar5 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeInitDrivers",zVar5);
          unaff_R12D = zVar5;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return unaff_R12D;
    }
    zVar5 = (*pcVar2)(pCount,phDrivers,desc);
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar4 + 0x28))(plVar4,pCount,phDrivers,desc,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeInitDrivers",result);
          unaff_R12D = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar6 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar6 != 0);
    }
    if (bVar9) {
      return unaff_R12D;
    }
  }
  logAndPropagateResult("zeInitDrivers",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeInitDrivers(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of drivers available.
                                                        ///< if count is greater than the number of drivers available, then the
                                                        ///< loader shall update the value with the correct number of drivers available.
        ze_driver_handle_t* phDrivers,                  ///< [in,out][optional][range(0, *pCount)] array of driver instance handles.
                                                        ///< if count is less than the number of drivers available, then the loader
                                                        ///< shall only retrieve that number of drivers.
        ze_init_driver_type_desc_t* desc                ///< [in] descriptor containing the driver type initialization details
                                                        ///< including ::ze_init_driver_type_flag_t combinations.
        )
    {
        context.logger->log_trace("zeInitDrivers(pCount, phDrivers, desc)");

        auto pfnInitDrivers = context.zeDdiTable.Global.pfnInitDrivers;

        if( nullptr == pfnInitDrivers )
            return logAndPropagateResult("zeInitDrivers", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitDriversPrologue( pCount, phDrivers, desc );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInitDrivers", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeInitDriversPrologue( pCount, phDrivers, desc );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInitDrivers", result);
        }

        auto driver_result = pfnInitDrivers( pCount, phDrivers, desc );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitDriversEpilogue( pCount, phDrivers, desc ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInitDrivers", result);
        }

        return logAndPropagateResult("zeInitDrivers", driver_result);
    }